

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O1

void __thiscall mp::NLSuffix::~NLSuffix(NLSuffix *this)

{
  pointer pdVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pdVar1 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->values_).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pcVar2 = (this->table_)._M_dataplus._M_p;
  paVar3 = &(this->table_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar3 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

NLSuffix(std::string name, int kind, std::vector<double> v={})
    : name_(std::move(name)), table_({}), kind_(kind),
      values_(std::move(v)) { }